

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

void __thiscall rapic::scan::reset(scan *this)

{
  long in_RDI;
  
  std::vector<rapic::header,_std::allocator<rapic::header>_>::clear
            ((vector<rapic::header,_std::allocator<rapic::header>_> *)0x111978);
  std::vector<rapic::ray_header,_std::allocator<rapic::ray_header>_>::clear
            ((vector<rapic::ray_header,_std::allocator<rapic::ray_header>_> *)0x111986);
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1119a2);
  *(undefined4 *)(in_RDI + 0x50) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x54) = 0xffffffff;
  std::__cxx11::string::clear();
  *(undefined4 *)(in_RDI + 0x78) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x7c) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0x84) = 0x7fc00000;
  *(undefined4 *)(in_RDI + 0x88) = 0x7fc00000;
  *(undefined4 *)(in_RDI + 0x8c) = 0x7fc00000;
  return;
}

Assistant:

auto scan::reset() -> void
{
  headers_.clear();
  ray_headers_.clear();
  rays_ = 0;
  bins_ = 0;
  level_data_.clear();

  station_id_ = -1;
  volume_id_ = -1;
  product_.clear();
  pass_ = -1;
  pass_count_ = -1;
  is_rhi_ = false;
  angle_min_ = fnan;
  angle_max_ = fnan;
  angle_resolution_ = fnan;
}